

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall
RasterizerA3<4U>::_addLine<long>(RasterizerA3<4U> *this,long x0,long y0,long x1,long y1)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  BitWord *pBVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  bool bVar34;
  uint local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  uint local_a0;
  long local_90;
  long local_80;
  long local_70;
  int local_60;
  
  uVar25 = y1 - y0;
  if (uVar25 != 0) {
    uVar7 = x1 - x0;
    uVar20 = -uVar7;
    if (0 < (long)uVar7) {
      uVar20 = uVar7;
    }
    uVar7 = -uVar25;
    if (0 < (long)uVar25) {
      uVar7 = uVar25;
    }
    local_cc = 1;
    if (x1 < x0) {
      local_d0 = -1;
      uVar21 = y0;
      local_c8 = x1;
      local_70 = x0;
    }
    else {
      local_d0 = 1;
      uVar21 = y1;
      local_c8 = x0;
      y1 = y0;
      local_70 = x1;
    }
    if ((long)uVar21 < y1) {
      local_cc = -1;
      uVar21 = y1 ^ 0xff;
      lVar17 = (ulong)((char)uVar21 != -1) * 0x200;
      y1 = (uVar21 + lVar17) - 0x1ff;
      uVar21 = (lVar17 + uVar21 + uVar7) - 0x1ff;
      local_d0 = -local_d0;
    }
    uVar28 = local_c8 >> 8;
    uVar31 = (uint)local_c8 & 0xff;
    uVar23 = (ulong)uVar31;
    uVar33 = (ulong)y1 >> 8;
    uVar32 = (uint)((ulong)y1 >> 8);
    iVar29 = (int)(uVar21 >> 8);
    iVar30 = iVar29 - uVar32;
    uVar18 = (uint)(local_c8 >> 0x10);
    iVar19 = (int)(local_c8 >> 8);
    if ((int)(uVar31 + (int)uVar20) < 0x101 && iVar30 == 0) {
      uVar5 = (this->_yBounds).start;
      uVar16 = (this->_yBounds).end;
      if ((int)uVar32 <= (int)uVar5) {
        uVar5 = uVar32;
      }
      (this->_yBounds).start = uVar5;
      if ((int)uVar16 <= (int)uVar32) {
        uVar16 = uVar32;
      }
      (this->_yBounds).end = uVar16;
      this->_bits[(long)(int)uVar32 * this->_bitStride + (ulong)(uVar18 & 0xffffff)] =
           this->_bits[(long)(int)uVar32 * this->_bitStride + (ulong)(uVar18 & 0xffffff)] |
           1L << ((byte)(local_c8 >> 10) & 0x3f);
      _mergeCell(this,iVar19,uVar32,(int)uVar25,((int)uVar20 + uVar31 * 2) * (int)uVar25);
      return;
    }
    uVar24 = (uint)y1 & 0xff;
    uVar15 = (uint)uVar21 & 0xff;
    uVar5 = (uint)((uVar21 & 0xff) != 0);
    uVar26 = (uVar5 + iVar30) * local_cc + uVar32;
    uVar16 = uVar32;
    if (uVar26 < uVar32) {
      uVar16 = uVar26;
    }
    uVar12 = uVar32;
    if (uVar32 < uVar26) {
      uVar12 = uVar26;
    }
    uVar2 = (this->_yBounds).start;
    uVar3 = (this->_yBounds).end;
    if ((int)uVar2 < (int)uVar16) {
      uVar16 = uVar2;
    }
    (this->_yBounds).start = uVar16;
    if ((int)uVar12 < (int)uVar3) {
      uVar12 = uVar3;
    }
    (this->_yBounds).end = uVar12;
    if (x1 != x0) {
      uVar21 = (uVar20 << 8) / uVar7;
      uVar13 = (uVar20 << 8) % uVar7;
      uVar14 = (uVar7 << 8) % uVar20;
      uVar8 = 0;
      uVar25 = uVar20;
      local_d4 = uVar15;
      if (iVar30 != 0) {
        uVar8 = (0x100 - uVar24) * uVar20;
        uVar25 = uVar8 / uVar7;
        uVar8 = uVar8 % uVar7;
        local_d4 = 0x100;
      }
      if (iVar19 == (int)((ulong)local_70 >> 8)) {
        uVar9 = 0;
        uVar10 = uVar7;
      }
      else {
        uVar9 = (0x100 - uVar31) * uVar7;
        uVar10 = uVar9 / uVar20;
        uVar9 = uVar9 % uVar20;
      }
      local_90 = uVar9 - (uVar20 >> 1);
      local_80 = uVar8 - (uVar7 >> 1);
      local_60 = (int)((uVar7 << 8) / uVar20);
      if (uVar7 < uVar20) {
        uVar18 = uVar24 + (int)uVar10;
        if ((int)(uVar31 + (int)uVar25) < 0x101) {
          local_c8 = local_c8 + uVar25;
          iVar29 = (local_d4 - uVar24) * local_d0;
          iVar22 = ((int)uVar25 + uVar31 * 2) * iVar29;
          iVar19 = 0;
          goto LAB_00105ce6;
        }
        iVar19 = 1;
        do {
          local_c8 = local_c8 + uVar25;
          iVar29 = (int)(local_c8 >> 8);
          if ((int)uVar28 == iVar29) {
            __assert_fail("ex0 != ex1",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e7,
                          "void RasterizerA3<4>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 4, Fixed = long]"
                         );
          }
          bVar34 = (local_c8 & 0xff) != 0;
          local_a0 = (uint)local_c8 & 0xff;
          iVar27 = ((int)uVar23 + 0x100) * (int)uVar10;
          iVar22 = (int)uVar33;
          uVar25 = uVar28 >> 2 & 0x3fffffff;
          IntUtils::bitVectorFill<unsigned_long>
                    (this->_bits + (long)iVar22 * this->_bitStride,uVar25,
                     (ulong)((((uint)bVar34 + iVar29 >> 2) - (int)uVar25) + 1));
          iVar29 = (uint)bVar34 + iVar29 + -1;
          while( true ) {
            iVar6 = (int)uVar28;
            if (iVar29 == iVar6) break;
            _mergeCell(this,iVar6,iVar22,(int)uVar10 * local_d0,iVar27 * local_d0);
            lVar17 = local_90 + uVar14;
            uVar25 = 0;
            if (-1 < lVar17) {
              uVar25 = uVar20;
            }
            local_90 = lVar17 - uVar25;
            uVar31 = (uint)(-1 < lVar17) + local_60;
            uVar10 = (ulong)uVar31;
            uVar18 = uVar18 + uVar31;
            iVar27 = uVar31 * 0x100;
            uVar28 = (ulong)(iVar6 + 1);
          }
          uVar31 = 0x100;
          if ((local_c8 & 0xff) != 0) {
            uVar31 = local_a0;
          }
          iVar27 = ((local_d4 - uVar18) + (int)uVar10) * local_d0;
          _mergeCell(this,iVar29,iVar22,iVar27,uVar31 * iVar27);
          if ((local_c8 & 0xff) == 0) {
            uVar18 = uVar18 + local_60;
            local_90 = local_90 + uVar14;
            if (-1 < local_90) {
              local_90 = local_90 - uVar20;
              uVar18 = uVar18 + 1;
            }
          }
          uVar33 = (ulong)(uint)(iVar22 + local_cc);
          iVar19 = iVar19 + -1;
          if (iVar19 == 0) {
            if (iVar22 + local_cc == uVar26) {
              return;
            }
            do {
              uVar32 = (uint)uVar33;
              if (1 < iVar30) {
                iVar19 = iVar30 + -1;
                local_d4 = 0x100;
                iVar30 = 1;
                break;
              }
              uVar25 = local_70 - local_c8;
              uVar28 = local_c8 >> 8;
              uVar23 = local_c8 & 0xff;
              uVar31 = (uint)uVar23;
              if (0x100 < (int)(uVar31 + (int)uVar25)) {
                local_d4 = uVar15;
                iVar19 = iVar30;
                iVar30 = 1;
                goto LAB_00105dbc;
              }
              iVar29 = uVar15 * local_d0;
              iVar22 = ((int)uVar25 + uVar31 * 2) * iVar29;
              iVar19 = iVar30 + -1;
              iVar30 = 1;
              local_d4 = uVar15;
LAB_00105ce6:
              this->_bits[this->_bitStride * (long)(int)uVar32 + (uVar28 >> 8 & 0xffffff)] =
                   this->_bits[this->_bitStride * (long)(int)uVar32 + (uVar28 >> 8 & 0xffffff)] |
                   1L << ((byte)((uVar28 & 0xffffffff) >> 2) & 0x3f);
              _mergeCell(this,(int)uVar28,uVar32,iVar29,iVar22);
              uVar33 = (ulong)(uVar32 + local_cc);
              if (uVar32 + local_cc == uVar26) {
                return;
              }
              if (uVar31 + (int)uVar25 == 0x100) {
                uVar18 = uVar18 + local_60;
                local_90 = local_90 + uVar14;
                if (-1 < local_90) {
                  local_90 = local_90 - uVar20;
                  uVar18 = uVar18 + 1;
                }
              }
            } while (iVar19 == 0);
          }
          lVar17 = local_80 + uVar13;
          uVar25 = 0;
          if (-1 < lVar17) {
            uVar25 = uVar7;
          }
          local_80 = lVar17 - uVar25;
          uVar25 = (-1 < lVar17) + uVar21;
          uVar28 = local_c8 >> 8;
          uVar23 = local_c8 & 0xff;
LAB_00105dbc:
          uVar18 = uVar18 - 0x100;
          uVar10 = (ulong)uVar18;
          if (0x100 < uVar18) {
            __assert_fail("cover >= 0 && cover <= 256",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e0,
                          "void RasterizerA3<4>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 4, Fixed = long]"
                         );
          }
        } while( true );
      }
      uVar31 = (int)uVar10 + (uint)y1;
      local_c8._0_4_ = 1;
LAB_00105aac:
      lVar17 = (long)(int)uVar33;
      do {
        iVar27 = (int)uVar23;
        uVar18 = (int)uVar25 + iVar27;
        iVar22 = (int)uVar28;
        iVar19 = (int)lVar17;
        if ((int)uVar18 < 0x101) {
          iVar6 = (local_d4 - uVar24) * local_d0;
          this->_bits[this->_bitStride * lVar17 + (uVar28 >> 8 & 0xffffff)] =
               this->_bits[this->_bitStride * lVar17 + (uVar28 >> 8 & 0xffffff)] |
               1L << ((byte)((uVar28 & 0xffffffff) >> 2) & 0x3f);
          _mergeCell(this,iVar22,iVar19,iVar6,(iVar27 + uVar18) * iVar6);
          if (uVar18 == 0x100) {
            uVar23 = 0;
            goto LAB_00105bd3;
          }
          uVar23 = (ulong)uVar18;
        }
        else {
          uVar31 = uVar31 & 0xff;
          iVar6 = (uVar31 - uVar24) * local_d0;
          this->_bits[this->_bitStride * lVar17 + (uVar28 >> 8 & 0xffffff)] =
               this->_bits[this->_bitStride * lVar17 + (uVar28 >> 8 & 0xffffff)] |
               1L << ((byte)((uVar28 & 0xffffffff) >> 2) & 0x3f);
          _mergeCell(this,iVar22,iVar19,iVar6,(iVar27 + 0x100) * iVar6);
          uVar16 = iVar22 + 1;
          iVar27 = (local_d4 - uVar31) * local_d0;
          this->_bits[this->_bitStride * lVar17 + (ulong)(uVar16 >> 8)] =
               this->_bits[this->_bitStride * lVar17 + (ulong)(uVar16 >> 8)] |
               1L << ((byte)(uVar16 >> 2) & 0x3f);
          _mergeCell(this,uVar16,iVar19,iVar27,iVar27 * (uVar18 & 0xff));
          uVar23 = (ulong)(uVar18 & 0xff);
LAB_00105bd3:
          uVar28 = (ulong)(iVar22 + 1);
          uVar31 = uVar31 + local_60;
          local_90 = local_90 + uVar14;
          if (-1 < local_90) {
            local_90 = local_90 - uVar20;
            uVar31 = uVar31 + 1;
          }
        }
        local_c8._0_4_ = (int)local_c8 + -1;
        if ((int)local_c8 != 0) goto LAB_00105c8a;
        if ((~uVar32 + uVar5 + iVar29) * local_cc + uVar32 == iVar19) {
          return;
        }
        if (1 < iVar30) goto LAB_00105c6b;
        lVar17 = lVar17 + local_cc;
        uVar25 = local_70 - (uVar23 + (uint)((int)uVar28 << 8));
        uVar24 = 0;
        local_d4 = uVar15;
        local_c8._0_4_ = iVar30;
        iVar30 = 1;
      } while( true );
    }
    uVar25 = uVar25 & 0xffffffff;
    if (0 < iVar30) {
      uVar25 = (ulong)((0x100 - uVar24) * local_d0);
    }
    pBVar4 = this->_bits;
    iVar29 = 1;
    while( true ) {
      uVar33 = (ulong)(int)uVar33;
      do {
        puVar1 = (ulong *)((long)pBVar4 +
                          this->_bitStride * uVar33 * 8 + (ulong)((uVar18 & 0xffffff) << 3));
        *puVar1 = *puVar1 | 1L << ((byte)(local_c8 >> 10) & 0x3f);
        _mergeCell(this,iVar19,(int)uVar33,(int)uVar25,uVar31 * 2 * (int)uVar25);
        uVar33 = uVar33 + (long)local_cc;
        iVar29 = iVar29 + -1;
      } while (iVar29 != 0);
      if (uVar26 == (uint)uVar33) break;
      uVar32 = uVar15 * local_d0;
      if (1 < iVar30) {
        uVar32 = local_d0 << 8;
      }
      uVar25 = (ulong)uVar32;
      iVar29 = iVar30 - (uint)(1 < iVar30);
      iVar30 = 1;
    }
  }
  return;
LAB_00105c6b:
  local_c8._0_4_ = iVar30 + -1;
  uVar24 = 0;
  local_d4 = 0x100;
  iVar30 = 1;
LAB_00105c8a:
  lVar11 = local_80 + uVar13;
  uVar25 = 0;
  if (-1 < lVar11) {
    uVar25 = uVar7;
  }
  local_80 = lVar11 - uVar25;
  uVar25 = (-1 < lVar11) + uVar21;
  uVar33 = lVar17 + local_cc;
  goto LAB_00105aac;
}

Assistant:

void RasterizerA3<N>::_addLine(Fixed x0, Fixed y0, Fixed x1, Fixed y1) noexcept {
  Fixed dx = x1 - x0;
  Fixed dy = y1 - y0;

  if (dy == Fixed(0))
    return;

  int cover = int(dy);
  int area;

  if (dx < 0) dx = -dx;
  if (dy < 0) dy = -dy;

  int yInc = 1;
  int coverSign = 1;

  // Fix RIGHT-TO-LEFT direction:
  //   - swap coordinates,
  //   - invert cover-sign.
  if (x0 > x1) {
    std::swap(x0, x1);
    std::swap(y0, y1);
    coverSign = -coverSign;
  }

  // Fix BOTTOM-TO-TOP direction:
  //   - invert fractional parts of y0 and y1,
  //   - invert cover-sign.
  if (y0 > y1) {
    y0 ^= kA8Mask;
    y0 += int(y0 & kA8Mask) == kA8Mask ? 1 - kA8Scale * 2 : 1;
    y1  = y0 + dy;

    yInc = -1;
    coverSign = -coverSign;
  }

  // Extract the raster and fractional coordinates.
  int ex0 = int(x0 >> kA8Shift);
  int fx0 = int(x0 & kA8Mask);

  int ey0 = int(y0 >> kA8Shift);
  int fy0 = int(y0 & kA8Mask);

  int ex1 = int(x1 >> kA8Shift);
  int fy1 = int(y1 & kA8Mask);

  // NOTE: Variable `i` is just a loop counter. We need to make sure to handle
  // the start and end points of the line, which use the same loop body, but
  // require special handling.
  //
  //   - `i` - How many Y iterations to do now.
  //   - `j` - How many Y iterations to do next.
  int i = 1;
  int j = int(y1 >> kA8Shift) - ey0;

  // Single-Cell.
  if ((j | ((fx0 + int(dx)) > 256)) == 0) {
    _yBounds.union_(ey0, ey0);
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);

    _mergeCell(ex0, ey0, cover, (fx0 * 2 + int(dx)) * cover);
    return;
  }

  uint32_t ey1 = ey0 + (j + (fy1 != 0)) * yInc;
  if (ey0 <= ey1)
    _yBounds.union_(ey0, ey1);
  else
    _yBounds.union_(ey1, ey0);

  // Strictly horizontal line (always one cell per scanline).
  if (dx == 0) {
    if (j > 0)
      cover = (kA8Scale - fy0) * coverSign;

    fy0  = coverSign << kA8Shift;
    fy1 *= coverSign;
    fx0 *= 2;

    size_t bitIndex = ex0 / kPixelsPerOneBit;
    BitWord* bitBase = _bits + (bitIndex / kBitWordBits);
    BitWord bitMask = BitWord(1) << (bitIndex % kBitWordBits);

    for (;;) {
      area = fx0 * cover;
      do {
        bitBase[ey0 * _bitStride] |= bitMask;
        _mergeCell(ex0, ey0, cover, area);
        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      cover = fy1;
      i = j;
      j = 1;

      if (i <= 1)
        continue;

      cover = fy0;
      i--;
    }

    return;
  }

  Fixed xErr = -dy / 2, xBase, xLift, xRem, xDlt = dx;
  Fixed yErr = -dx / 2, yBase, yLift, yRem, yDlt = dy;

  xBase = dx * kA8Scale;
  xLift = xBase / dy;
  xRem  = xBase % dy;

  yBase = dy * kA8Scale;
  yLift = yBase / dx;
  yRem  = yBase % dx;

  if (j != 0) {
    Fixed p = Fixed(kA8Scale - fy0) * dx;
    xDlt  = p / dy;
    xErr += p % dy;
    fy1 = kA8Scale;
  }

  if (ex0 != ex1) {
    Fixed p = Fixed(kA8Scale - fx0) * dy;
    yDlt = p / dx;
    yErr += p % dx;
  }

  // Vertical direction -> One/Two cells per scanline.
  if (dy >= dx) {
    int yAcc = int(y0) + int(yDlt);

    goto VertSkip;
    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

VertSkip:
        area = fx0;
        fx0 += int(xDlt);

        if (fx0 <= 256) {
          cover = (fy1 - fy0) * coverSign;
          area  = (area + fx0) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

          if (fx0 == 256) {
            ex0++;
            fx0 = 0;
            goto VertAdvance;
          }
        }
        else {
          yAcc &= 0xFF;
          fx0  &= kA8Mask;

          cover = (yAcc - fy0) * coverSign;
          area  = (area + kA8Scale) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);
          ex0++;

          cover = (fy1 - yAcc) * coverSign;
          area  = fx0 * cover;
          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

VertAdvance:
          yAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; yAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      i = j;
      j = 1;

      if (i > 1) {
        fy0 = 0;
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy0 = 0;
        fy1 = int(y1 & kA8Mask);

        xDlt = x1 - (ex0 << 8) - fx0;
        goto VertSkip;
      }
    }

    return;
  }
  // Horizontal direction -> Two or more cells per scanline.
  else {
    int fx1;
    int coverAcc = fy0;

    cover = int(yDlt);
    coverAcc += cover;

    if (j != 0)
      fy1 = kA8Scale;

    if (fx0 + int(xDlt) > 256)
      goto HorzInside;

    x0 += xDlt;

    cover = (fy1 - fy0) * coverSign;
    area = (fx0 * 2 + int(xDlt)) * cover;

HorzSingle:
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
    _mergeCell(ex0, ey0, cover, area);

    ey0 += yInc;
    if (ey0 == ey1)
      return;

    if (fx0 + int(xDlt) == 256) {
      coverAcc += int(yLift);
      yErr += yRem;
      if (yErr >= 0) { yErr -= dx; coverAcc++; }
    }

    if (--i == 0)
      goto HorzAfter;

    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

HorzSkip:
        coverAcc -= 256;
        cover = coverAcc;
        assert(cover >= 0 && cover <= 256);

HorzInside:
        x0 += xDlt;

        ex1 = int(x0 >> kA8Shift);
        fx1 = int(x0 & kA8Mask);
        assert(ex0 != ex1);

        if (fx1 == 0)
          fx1 = kA8Scale;
        else
          ex1++;

        area = (fx0 + kA8Scale) * cover;
        IntUtils::bitVectorFill(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, (ex1 / kPixelsPerOneBit) - (ex0 / kPixelsPerOneBit) + 1);

        while (ex0 != ex1 - 1) {
          _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

          cover = int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; cover++; }

          coverAcc += cover;
          area  = kA8Scale * cover;

          ex0++;
        }

        cover += fy1 - coverAcc;
        area   = fx1 * cover;
        _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

        if (fx1 == kA8Scale) {
          coverAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; coverAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

HorzAfter:
      i = j;
      j = 1;

      if (i > 1) {
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy1 = int(y1 & kA8Mask);
        xDlt = x1 - x0;

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

        if (fx0 + int(xDlt) <= 256) {
          cover = fy1 * coverSign;
          area = (fx0 * 2 + int(xDlt)) * cover;
          goto HorzSingle;
        }
        else {
          goto HorzSkip;
        }
      }
    }

    return;
  }
}